

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::BinaryToDecimal::BinaryToDecimal
          (BinaryToDecimal *this,Span<unsigned_int> data,uint128 v,int exp)

{
  size_type sVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  reference puVar6;
  reference pvVar7;
  uint128 lhs;
  uint local_84;
  uint32_t first;
  uint64_t tmp;
  size_t i;
  uint32_t carry;
  uint128 local_58;
  int local_44;
  uint64_t uStack_40;
  int offset;
  size_t after_chunk_index;
  BinaryToDecimal *pBStack_30;
  int exp_local;
  BinaryToDecimal *this_local;
  uint128 v_local;
  Span<unsigned_int> data_local;
  
  v_local.lo_ = v.hi_;
  this_local = (BinaryToDecimal *)v.lo_;
  v_local.hi_ = (uint64_t)data.ptr_;
  this->size_ = 0;
  after_chunk_index._4_4_ = exp;
  pBStack_30 = this;
  Span<unsigned_int>::
  Span<absl::lts_20250127::Span<unsigned_int>,_void,_absl::lts_20250127::Span<unsigned_int>,_0>
            (&this->data_,(Span<unsigned_int> *)&v_local.hi_);
  uStack_40 = (uint64_t)(after_chunk_index._4_4_ / 0x20 + 1);
  sVar5 = ChunksNeeded(after_chunk_index._4_4_);
  this->decimal_end_ = sVar5;
  this->decimal_start_ = sVar5;
  lhs.hi_._0_4_ = after_chunk_index._4_4_ % 0x20;
  lhs.lo_ = v_local.lo_;
  lhs.hi_._4_4_ = 0;
  local_44 = (int)lhs.hi_;
  local_58 = lts_20250127::operator<<((lts_20250127 *)this_local,lhs,0x20);
  uVar4 = uint128::operator_cast_to_unsigned_int(&local_58);
  puVar6 = Span<unsigned_int>::operator[](&this->data_,uStack_40 - 1);
  *puVar6 = uVar4;
  uint128::operator>>=((uint128 *)&this_local,0x20 - local_44);
  while (bVar3 = uint128::operator_cast_to_bool((uint128 *)&this_local), bVar3) {
    uVar4 = uint128::operator_cast_to_unsigned_int((uint128 *)&this_local);
    sVar1 = uStack_40;
    uStack_40 = uStack_40 + 1;
    puVar6 = Span<unsigned_int>::operator[](&this->data_,sVar1);
    *puVar6 = uVar4;
    uint128::operator>>=((uint128 *)&this_local,0x20);
  }
  while( true ) {
    if (uStack_40 == 0) {
      sVar1 = this->decimal_start_;
      this->decimal_start_ = sVar1 + 1;
      puVar6 = Span<unsigned_int>::operator[](&this->data_,sVar1);
      for (local_84 = *puVar6; local_84 != 0; local_84 = local_84 / 10) {
        sVar5 = this->size_ + 1;
        this->size_ = sVar5;
        pvVar7 = std::array<char,_9UL>::operator[](&this->digits_,9 - sVar5);
        *pvVar7 = (char)((ulong)local_84 % 10) + '0';
      }
      return;
    }
    i._4_4_ = 0;
    for (tmp = uStack_40; tmp != 0; tmp = tmp - 1) {
      puVar6 = Span<unsigned_int>::operator[](&this->data_,tmp - 1);
      uVar4 = *puVar6;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = CONCAT44(i._4_4_,uVar4);
      puVar6 = Span<unsigned_int>::operator[](&this->data_,tmp - 1);
      *puVar6 = SUB164(auVar2 / ZEXT816(1000000000),0);
      i._4_4_ = (uint)(CONCAT44(i._4_4_,uVar4) % 1000000000);
    }
    puVar6 = Span<unsigned_int>::operator[](&this->data_,uStack_40 - 1);
    if (*puVar6 == 0) {
      uStack_40 = uStack_40 - 1;
    }
    this->decimal_start_ = this->decimal_start_ - 1;
    if (this->decimal_start_ == uStack_40 - 1) break;
    puVar6 = Span<unsigned_int>::operator[](&this->data_,this->decimal_start_);
    *puVar6 = i._4_4_;
  }
  __assert_fail("decimal_start_ != after_chunk_index - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                ,0xdd,
                "absl::str_format_internal::(anonymous namespace)::BinaryToDecimal::BinaryToDecimal(absl::Span<uint32_t>, uint128, int)"
               );
}

Assistant:

BinaryToDecimal(absl::Span<uint32_t> data, uint128 v, int exp) : data_(data) {
    // We need to print the digits directly into the sink object without
    // buffering them all first. To do this we need two things:
    // - to know the total number of digits to do padding when necessary
    // - to generate the decimal digits from the left.
    //
    // In order to do this, we do a two pass conversion.
    // On the first pass we convert the binary representation of the value into
    // a decimal representation in which each uint32_t chunk holds up to 9
    // decimal digits.  In the second pass we take each decimal-holding-uint32_t
    // value and generate the ascii decimal digits into `digits_`.
    //
    // The binary and decimal representations actually share the same memory
    // region. As we go converting the chunks from binary to decimal we free
    // them up and reuse them for the decimal representation. One caveat is that
    // the decimal representation is around 7% less efficient in space than the
    // binary one. We allocate an extra 10% memory to account for this. See
    // ChunksNeeded for this calculation.
    size_t after_chunk_index = static_cast<size_t>(exp / 32 + 1);
    decimal_start_ = decimal_end_ = ChunksNeeded(exp);
    const int offset = exp % 32;
    // Left shift v by exp bits.
    data_[after_chunk_index - 1] = static_cast<uint32_t>(v << offset);
    for (v >>= (32 - offset); v; v >>= 32)
      data_[++after_chunk_index - 1] = static_cast<uint32_t>(v);

    while (after_chunk_index > 0) {
      // While we have more than one chunk available, go in steps of 1e9.
      // `data_[after_chunk_index - 1]` holds the highest non-zero binary chunk,
      // so keep the variable updated.
      uint32_t carry = 0;
      for (size_t i = after_chunk_index; i > 0; --i) {
        uint64_t tmp = uint64_t{data_[i - 1]} + (uint64_t{carry} << 32);
        data_[i - 1] = static_cast<uint32_t>(tmp / uint64_t{1000000000});
        carry = static_cast<uint32_t>(tmp % uint64_t{1000000000});
      }

      // If the highest chunk is now empty, remove it from view.
      if (data_[after_chunk_index - 1] == 0)
        --after_chunk_index;

      --decimal_start_;
      assert(decimal_start_ != after_chunk_index - 1);
      data_[decimal_start_] = carry;
    }

    // Fill the first set of digits. The first chunk might not be complete, so
    // handle differently.
    for (uint32_t first = data_[decimal_start_++]; first != 0; first /= 10) {
      digits_[kDigitsPerChunk - ++size_] = first % 10 + '0';
    }
  }